

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UtestPlatform.cpp
# Opt level: O3

void GccPlatformSpecificRunTestInASeperateProcess
               (UtestShell *shell,TestPlugin *plugin,TestResult *result)

{
  ulong uVar1;
  long lVar2;
  int iVar3;
  int __pid;
  uint uVar4;
  int *piVar5;
  int status;
  SimpleString message;
  uint local_bc;
  UtestShell *local_b8;
  SimpleString local_b0;
  long local_a0;
  TestFailure local_98;
  
  local_bc = 0;
  iVar3 = (*PlatformSpecificFork)();
  if (iVar3 == -1) {
    SimpleString::SimpleString(&local_b0,"Call to fork() failed");
    TestFailure::TestFailure(&local_98,shell,&local_b0);
    (*result->_vptr_TestResult[0xd])(result,&local_98);
LAB_0011a49a:
    TestFailure::~TestFailure(&local_98);
    SimpleString::~SimpleString(&local_b0);
    return;
  }
  local_b8 = shell;
  if (iVar3 == 0) {
    uVar1 = result->failureCount_;
    (*shell->_vptr_UtestShell[0x25])(shell,plugin,result);
    _exit((uint)(uVar1 < result->failureCount_));
  }
  lVar2 = 0;
  do {
    while (local_a0 = lVar2, __pid = (*PlatformSpecificWaitPid)(iVar3,(int *)&local_bc,2),
          __pid != -1) {
      if ((local_bc & 0xff00) == 0 || (local_bc & 0x7f) != 0) {
        if (0x1ffffff < (int)((local_bc & 0x7f) * 0x1000000 + 0x1000000)) {
          SimpleString::SimpleString(&local_b0,"Failed in separate process - killed by signal ");
          StringFrom((int)&local_98);
          SimpleString::operator+=(&local_b0,(SimpleString *)&local_98);
          SimpleString::~SimpleString((SimpleString *)&local_98);
          TestFailure::TestFailure(&local_98,local_b8,&local_b0);
          (*result->_vptr_TestResult[0xd])(result,&local_98);
          goto LAB_0011a395;
        }
        if ((char)local_bc == '\x7f') {
          SimpleString::SimpleString(&local_b0,"Stopped in separate process - continuing");
          TestFailure::TestFailure(&local_98,local_b8,&local_b0);
          (*result->_vptr_TestResult[0xd])(result,&local_98);
          goto LAB_0011a395;
        }
      }
      else {
        SimpleString::SimpleString(&local_b0,"Failed in separate process");
        TestFailure::TestFailure(&local_98,local_b8,&local_b0);
        (*result->_vptr_TestResult[0xd])(result,&local_98);
LAB_0011a395:
        TestFailure::~TestFailure(&local_98);
        SimpleString::~SimpleString(&local_b0);
      }
      uVar4 = local_bc & 0xff;
      if ((char)local_bc == '\x7f') {
        kill(__pid,0x12);
        uVar4 = local_bc;
      }
      if ((uVar4 & 0x7f) == 0) {
        return;
      }
      lVar2 = local_a0;
      if (0x1ffffff < (int)((uVar4 & 0x7f) * 0x1000000 + 0x1000000)) {
        return;
      }
    }
    piVar5 = __errno_location();
    if (*piVar5 != 4) {
      SimpleString::SimpleString(&local_b0,"Call to waitpid() failed");
      TestFailure::TestFailure(&local_98,local_b8,&local_b0);
      (*result->_vptr_TestResult[0xd])(result,&local_98);
      goto LAB_0011a49a;
    }
    lVar2 = local_a0 + 1;
    if (local_a0 + 1 == 0x20) {
      SimpleString::SimpleString
                (&local_b0,
                 "Call to waitpid() failed with EINTR. Tried 30 times and giving up! Sometimes happens in debugger"
                );
      TestFailure::TestFailure(&local_98,local_b8,&local_b0);
      (*result->_vptr_TestResult[0xd])(result,&local_98);
      goto LAB_0011a49a;
    }
  } while( true );
}

Assistant:

static void GccPlatformSpecificRunTestInASeperateProcess(UtestShell* shell, TestPlugin* plugin, TestResult* result)
{
    const pid_t syscallError = -1;
    pid_t cpid;
    pid_t w;
    int status = 0;

    cpid = PlatformSpecificFork();

    if (cpid == syscallError) {
        result->addFailure(TestFailure(shell, "Call to fork() failed"));
        return;
    }

    if (cpid == 0) {            /* Code executed by child */
        const size_t initialFailureCount = result->getFailureCount(); // LCOV_EXCL_LINE
        shell->runOneTestInCurrentProcess(plugin, *result);        // LCOV_EXCL_LINE
        _exit(initialFailureCount < result->getFailureCount());    // LCOV_EXCL_LINE
    } else {                    /* Code executed by parent */
        size_t amountOfRetries = 0;
        do {
            w = PlatformSpecificWaitPid(cpid, &status, WUNTRACED);
            if (w == syscallError) {
                // OS X debugger causes EINTR
                if (EINTR == errno) {
                  if (amountOfRetries > 30) {
                    result->addFailure(TestFailure(shell, "Call to waitpid() failed with EINTR. Tried 30 times and giving up! Sometimes happens in debugger"));
                    return;
                  }
                  amountOfRetries++;
                }
                else {
                    result->addFailure(TestFailure(shell, "Call to waitpid() failed"));
                    return;
                }
            } else {
                SetTestFailureByStatusCode(shell, result, status);
                if (WIFSTOPPED(status)) kill(w, SIGCONT);
            }
        } while ((w == syscallError) || (!WIFEXITED(status) && !WIFSIGNALED(status)));
    }
}